

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIPSolution.cpp
# Opt level: O2

shared_ptr<JointPolicy> __thiscall BGIPSolution::GetJointPolicy(BGIPSolution *this)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  E *this_00;
  shared_count extraout_RDX;
  long in_RSI;
  Interface_ProblemToPolicyDiscretePure *pIVar4;
  element_type *peVar5;
  shared_ptr<JointPolicy> sVar6;
  shared_count local_18;
  
  if (*(char *)(in_RSI + 0x20) == '\x01') {
    if (*(long *)(in_RSI + 0x38) == 0) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"BGIPSolution::GetJointPolicy - No solution left in fixed size queue");
LAB_003ff001:
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    lVar2 = *(long *)(*(long *)(in_RSI + 0x28) + 0x10);
    pIVar4 = *(Interface_ProblemToPolicyDiscretePure **)(lVar2 + 0x10);
    peVar5 = *(element_type **)(lVar2 + 0x18);
    if (*(long *)(lVar2 + 0x18) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(lVar2 + 0x18) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  else {
    plVar3 = (long *)**(long **)(in_RSI + 0x68);
    if ((long *)(*(long **)(in_RSI + 0x68))[1] == plVar3) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"BGIPSolution::GetJointPolicy - No solution left in inf size queue");
      goto LAB_003ff001;
    }
    lVar2 = *plVar3;
    pIVar4 = *(Interface_ProblemToPolicyDiscretePure **)(lVar2 + 0x10);
    peVar5 = *(element_type **)(lVar2 + 0x18);
    if (*(long *)(lVar2 + 0x18) != 0) {
      LOCK();
      piVar1 = (int *)(*(long *)(lVar2 + 0x18) + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  local_18.pi_ = (sp_counted_base *)0x0;
  this->_m_pu = pIVar4;
  (this->_m_puShared).px = peVar5;
  boost::detail::shared_count::~shared_count(&local_18);
  sVar6.pn.pi_ = extraout_RDX.pi_;
  sVar6.px = (element_type *)this;
  return sVar6;
}

Assistant:

const boost::shared_ptr<JointPolicy> BGIPSolution::GetJointPolicy() const
{
    if(_m_useFixedCapacityPriorityQueue)
        if(_m_qFixedK.size() > 0)
            return(_m_qFixedK.top()->GetJPPV());
        else
            throw(E("BGIPSolution::GetJointPolicy - No solution left in fixed size queue"));
    else
        if(_m_qInfSize->size() > 0)
            return(_m_qInfSize->top()->GetJPPV());
        else
            throw(E("BGIPSolution::GetJointPolicy - No solution left in inf size queue"));
}